

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Bool write_nrx4_reg(Emulator *e,Channel *channel,Address addr,u8 value,u16 max_length)

{
  Bool BVar1;
  bool bVar2;
  Bool BVar3;
  bool bVar4;
  Bool next_frame_is_length;
  Bool was_length_enabled;
  Bool trigger;
  u16 max_length_local;
  u8 value_local;
  Address addr_local;
  Channel *channel_local;
  Emulator *e_local;
  
  BVar3 = (int)(uint)value >> 7;
  BVar1 = channel->length_enabled;
  channel->length_enabled = (int)(uint)value >> 6 & TRUE;
  channel->frequency = channel->frequency & 0xff;
  channel->frequency = channel->frequency | (value & 7) << 8;
  bVar4 = ((e->state).apu.frame & 1) != 1;
  bVar2 = false;
  if (((BVar1 == FALSE) && (bVar2 = false, channel->length_enabled != FALSE)) &&
     (bVar2 = false, bVar4)) {
    bVar2 = channel->length != 0;
  }
  if (((bVar2) && (channel->length = channel->length - 1, BVar3 == FALSE)) && (channel->length == 0)
     ) {
    channel->status = FALSE;
  }
  if (BVar3 != FALSE) {
    if (((channel->length == 0) && (channel->length = max_length, channel->length_enabled != FALSE))
       && (bVar4)) {
      channel->length = channel->length - 1;
    }
    if (channel->dac_enabled != FALSE) {
      channel->status = TRUE;
    }
  }
  return BVar3;
}

Assistant:

static Bool write_nrx4_reg(Emulator* e, Channel* channel, Address addr,
                           u8 value, u16 max_length) {
  Bool trigger = UNPACK(value, NRX4_INITIAL);
  Bool was_length_enabled = channel->length_enabled;
  channel->length_enabled = UNPACK(value, NRX4_LENGTH_ENABLED);
  channel->frequency &= 0xff;
  channel->frequency |= UNPACK(value, NRX4_FREQUENCY_HI) << 8;

  /* Extra length clocking occurs on NRX4 writes if the next APU frame isn't a
   * length counter frame. This only occurs on transition from disabled to
   * enabled. */
  Bool next_frame_is_length = (APU.frame & 1) == 1;
  if (UNLIKELY(!was_length_enabled && channel->length_enabled &&
               !next_frame_is_length && channel->length > 0)) {
    channel->length--;
    HOOK(write_nrx4_extra_length_clock_abi, addr, value, channel->length);
    if (!trigger && channel->length == 0) {
      HOOK(write_nrx4_disable_channel_ab, addr, value);
      channel->status = FALSE;
    }
  }

  if (trigger) {
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled && !next_frame_is_length) {
        channel->length--;
      }
      HOOK(write_nrx4_trigger_new_length_abi, addr, value, channel->length);
    }
    if (channel->dac_enabled) {
      channel->status = TRUE;
    }
  }

  HOOK(write_nrx4_info_abii, addr, value, trigger, channel->length_enabled);
  return trigger;
}